

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CPORTCommand::doWhat(CPORTCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  reference pvVar5;
  char *pcVar6;
  allocator local_1a9;
  undefined1 local_1a8 [8];
  string ret_2;
  undefined1 local_180 [8];
  string ret_1;
  undefined1 local_158 [8];
  string ret;
  undefined1 local_130 [4];
  int port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string ip;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  CClient *pClient_local;
  CPORTCommand *this_local;
  
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pClient;
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1a8,"530 Please login with USER and PASS.\r\n",&local_1a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    CClient::sendMsg((CClient *)
                     v.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a8);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_1a8);
  }
  else {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,",",&local_59);
      SplitString(&(this->super_CCommand).m_Args,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     pvVar5,".");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,1);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     pvVar5);
      std::operator+(&local_f0,&local_110,".");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,2);
      std::operator+(&local_d0,&local_f0,pvVar5);
      std::operator+(&local_b0,&local_d0,".");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     &local_b0,pvVar5);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,4);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(pcVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar3 = atoi(pcVar6);
      ret.field_2._12_4_ = iVar2 * 0x100 + iVar3;
      CClient::SetClientPortIpAndPort
                ((CClient *)
                 v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_90,
                 ret.field_2._12_4_);
      CClient::SetClientState
                ((CClient *)
                 v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,PORT);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_158,"200 PORT command successful.\r\n",
                 (allocator *)(ret_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_1.field_2._M_local_buf + 0xf));
      CClient::sendMsg((CClient *)
                       v.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_158);
      this_local._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_158);
      std::__cxx11::string::~string((string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_180,"500 Illegal PORT command.\r\n",
                 (allocator *)(ret_2.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
      CClient::sendMsg((CClient *)
                       v.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_180);
      this_local._4_4_ = -1;
      std::__cxx11::string::~string((string *)local_180);
    }
  }
  return this_local._4_4_;
}

Assistant:

int CPORTCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        if(!m_Args.empty()){
            vector<string> v;
            SplitString(m_Args,v,",");
            string ip = v[0] + "." + v[1] + "." + v[2] + "." + v[3];
            int port = atoi(v[4].c_str()) * 256 + atoi(v[5].c_str());
            pClient->SetClientPortIpAndPort(ip,port);
            pClient->SetClientState(PORT);

            string ret = "200 PORT command successful.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else{
            string ret = "500 Illegal PORT command.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}